

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti_tool.c
# Opt level: O0

int disp_nt_opts(char *mesg,nt_opts *opts)

{
  FILE *__stream;
  size_t sVar1;
  undefined8 in_stack_fffffffffffffed8;
  undefined4 uVar2;
  char *local_98;
  uint local_4c;
  int c;
  nt_opts *opts_local;
  char *mesg_local;
  
  uVar2 = (undefined4)((ulong)in_stack_fffffffffffffed8 >> 0x20);
  if (mesg != (char *)0x0) {
    fputs(mesg,_stderr);
  }
  if (opts == (nt_opts *)0x0) {
    fprintf(_stderr,"** disp_nt_opts: missing opts\n");
    mesg_local._4_4_ = -1;
  }
  else {
    fprintf(_stderr,
            "nt_opts @ %p\n   check_hdr, check_nim = %d, %d\n   diff_hdr, diff_nim   = %d, %d\n   disp_hdr, disp_nim   = %d, %d\n   disp_ana, disp_exts  = %d, %d\n   add_exts, rm_exts    = %d, %d\n   mod_hdr,  mod_nim    = %d, %d\n   swap_hdr, swap_ana   = %d, %d\n   swap_old             = %d\n   cbl, cci             = %d, %d\n   dts, dci_lines       = %d, %d\n   make_im              = %d\n"
            ,opts,(ulong)(uint)opts->check_hdr,(ulong)(uint)opts->check_nim,
            (ulong)(uint)opts->diff_hdr,CONCAT44(uVar2,opts->diff_nim),opts->disp_hdr,opts->disp_nim
            ,opts->disp_ana,opts->disp_exts,opts->add_exts,opts->rm_exts,opts->mod_hdr,opts->mod_nim
            ,opts->swap_hdr,opts->swap_ana,opts->swap_old,opts->cbl,opts->cci,opts->dts,
            opts->dci_lines,opts->make_im);
    fprintf(_stderr,"   ci_dims[8]          = ");
    disp_raw_data(opts->ci_dims,8,8,' ',1);
    fprintf(_stderr,"   new_dim[8]          = ");
    disp_raw_data(opts->new_dim,8,8,' ',1);
    if (opts->prefix == (char *)0x0) {
      local_98 = "(NULL)";
    }
    else {
      local_98 = opts->prefix;
    }
    fprintf(_stderr,
            "\n   new_datatype        = %d\n   debug, keep_hist    = %d, %d\n   overwrite           = %d\n   prefix              = \'%s\'\n"
            ,(ulong)(uint)opts->new_datatype,(ulong)(uint)opts->debug,(ulong)(uint)opts->keep_hist,
            (ulong)(uint)opts->overwrite,local_98);
    fprintf(_stderr,"   elist   (length %d)  :\n",(ulong)(uint)(opts->elist).len);
    for (local_4c = 0; (int)local_4c < (opts->elist).len; local_4c = local_4c + 1) {
      fprintf(_stderr,"      %d : %s\n",(ulong)local_4c,(opts->elist).list[(int)local_4c]);
    }
    fprintf(_stderr,"   etypes  (length %d)  : ",(ulong)(uint)(opts->etypes).len);
    disp_raw_data((opts->etypes).list,8,(opts->etypes).len,' ',0);
    fputc(10,_stderr);
    fprintf(_stderr,"   flist   (length %d)  :\n",(ulong)(uint)(opts->flist).len);
    for (local_4c = 0; (int)local_4c < (opts->flist).len; local_4c = local_4c + 1) {
      fprintf(_stderr,"      %d : %s\n",(ulong)local_4c,(opts->flist).list[(int)local_4c]);
    }
    fprintf(_stderr,"   vlist   (length %d)  :\n",(ulong)(uint)(opts->vlist).len);
    for (local_4c = 0; (int)local_4c < (opts->vlist).len; local_4c = local_4c + 1) {
      fprintf(_stderr,"      %d : %s\n",(ulong)local_4c,(opts->vlist).list[(int)local_4c]);
    }
    fprintf(_stderr,"   infiles (length %d)  :\n",(ulong)(uint)(opts->infiles).len);
    for (local_4c = 0; __stream = _stderr, (int)local_4c < (opts->infiles).len;
        local_4c = local_4c + 1) {
      fprintf(_stderr,"      %d : %s\n",(ulong)local_4c,(opts->infiles).list[(int)local_4c]);
    }
    sVar1 = strlen(opts->command);
    fprintf(__stream,"   command len         : %d\n",sVar1 & 0xffffffff);
    mesg_local._4_4_ = 0;
  }
  return mesg_local._4_4_;
}

Assistant:

int disp_nt_opts(char * mesg, nt_opts * opts)
{
   int c;

   if( mesg ) fputs(mesg, stderr);
   if( ! opts )
   {
      fprintf(stderr,"** disp_nt_opts: missing opts\n");
      return -1;
   }

   fprintf(stderr,"nt_opts @ %p\n"
                  "   check_hdr, check_nim = %d, %d\n"
                  "   diff_hdr, diff_nim   = %d, %d\n"
                  "   disp_hdr, disp_nim   = %d, %d\n"
                  "   disp_ana, disp_exts  = %d, %d\n"
                  "   add_exts, rm_exts    = %d, %d\n"
                  "   mod_hdr,  mod_nim    = %d, %d\n"
                  "   swap_hdr, swap_ana   = %d, %d\n"
                  "   swap_old             = %d\n"
                  "   cbl, cci             = %d, %d\n"
                  "   dts, dci_lines       = %d, %d\n"
                  "   make_im              = %d\n",
            (void *)opts,
            opts->check_hdr, opts->check_nim,
            opts->diff_hdr, opts->diff_nim, opts->disp_hdr, opts->disp_nim,
            opts->disp_ana, opts->disp_exts, opts->add_exts, opts->rm_exts,
            opts->mod_hdr, opts->mod_nim,
            opts->swap_hdr, opts->swap_ana, opts->swap_old,
            opts->cbl, opts->cci,
            opts->dts, opts->dci_lines, opts->make_im );

   fprintf(stderr,"   ci_dims[8]          = ");
   disp_raw_data(opts->ci_dims, DT_INT32, 8, ' ', 1);
   fprintf(stderr,"   new_dim[8]          = ");
   disp_raw_data(opts->new_dim, DT_INT32, 8, ' ', 1);

   fprintf(stderr,"\n"
                  "   new_datatype        = %d\n"
                  "   debug, keep_hist    = %d, %d\n"
                  "   overwrite           = %d\n"
                  "   prefix              = '%s'\n",
            opts->new_datatype, opts->debug, opts->keep_hist, opts->overwrite,
            opts->prefix ? opts->prefix : "(NULL)" );

   fprintf(stderr,"   elist   (length %d)  :\n", opts->elist.len);
   for( c = 0; c < opts->elist.len; c++ )
       fprintf(stderr,"      %d : %s\n", c, opts->elist.list[c]);

   fprintf(stderr,"   etypes  (length %d)  : ", opts->etypes.len);
   disp_raw_data(opts->etypes.list, DT_INT32, opts->etypes.len, ' ', 0);
   fputc('\n',stderr);

   fprintf(stderr,"   flist   (length %d)  :\n", opts->flist.len);
   for( c = 0; c < opts->flist.len; c++ )
       fprintf(stderr,"      %d : %s\n", c, opts->flist.list[c]);

   fprintf(stderr,"   vlist   (length %d)  :\n", opts->vlist.len);
   for( c = 0; c < opts->vlist.len; c++ )
       fprintf(stderr,"      %d : %s\n", c, opts->vlist.list[c]);

   fprintf(stderr,"   infiles (length %d)  :\n", opts->infiles.len);
   for( c = 0; c < opts->infiles.len; c++ )
       fprintf(stderr,"      %d : %s\n", c, opts->infiles.list[c]);

   fprintf(stderr,"   command len         : %d\n",(int)strlen(opts->command));

   return 0;
}